

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int openDirectory(char *zFilename,int *pFd)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  char local_228 [4];
  sxu32 n;
  char zDirname [513];
  uint local_1c;
  int fd;
  sxu32 ii;
  int *pFd_local;
  char *zFilename_local;
  
  stack0xffffffffffffffe0 = -1;
  local_1c = Systrcpy(local_228,0x201,zFilename,0);
  while( true ) {
    bVar3 = false;
    if (1 < local_1c) {
      bVar3 = local_228[local_1c] != '/';
    }
    if (!bVar3) break;
    local_1c = local_1c - 1;
  }
  if (local_1c != 0) {
    local_228[local_1c] = '\0';
    iVar1 = open(local_228,0);
    unique0x100000e9 = iVar1;
    if (-1 < iVar1) {
      uVar2 = fcntl(iVar1,1,0);
      fcntl(iVar1,2,(ulong)(uVar2 | 1));
    }
  }
  *pFd = stack0xffffffffffffffe0;
  iVar1 = -2;
  if (-1 < stack0xffffffffffffffe0) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int openDirectory(const char *zFilename, int *pFd){
  sxu32 ii;
  int fd = -1;
  char zDirname[MAX_PATHNAME+1];
  sxu32 n;
  n = Systrcpy(zDirname,sizeof(zDirname),zFilename,0);
  for(ii=n; ii>1 && zDirname[ii]!='/'; ii--);
  if( ii>0 ){
    zDirname[ii] = '\0';
    fd = open(zDirname, O_RDONLY|O_BINARY, 0);
    if( fd>=0 ){
#ifdef FD_CLOEXEC
      fcntl(fd, F_SETFD, fcntl(fd, F_GETFD, 0) | FD_CLOEXEC);
#endif
    }
  }
  *pFd = fd;
  return (fd>=0?UNQLITE_OK: UNQLITE_IOERR );
}